

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_writer.cpp
# Opt level: O1

unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true> __thiscall
duckdb::SingleFileTableDataWriter::GetRowGroupWriter
          (SingleFileTableDataWriter *this,RowGroup *row_group)

{
  TableCatalogEntry *table;
  element_type *peVar1;
  MetadataWriter *table_data_writer;
  SingleFileRowGroupWriter *this_00;
  
  table = (TableCatalogEntry *)
          (row_group->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
          _M_i;
  peVar1 = (row_group->owned_version_info).internal.
           super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  table_data_writer =
       (MetadataWriter *)
       (row_group->owned_version_info).internal.
       super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_00 = (SingleFileRowGroupWriter *)operator_new(0x28);
  SingleFileRowGroupWriter::SingleFileRowGroupWriter
            (this_00,table,(PartialBlockManager *)&peVar1->start,(TableDataWriter *)row_group,
             table_data_writer);
  (this->super_TableDataWriter)._vptr_TableDataWriter = (_func_int **)this_00;
  return (unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)
         (unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)this;
}

Assistant:

unique_ptr<RowGroupWriter> SingleFileTableDataWriter::GetRowGroupWriter(RowGroup &row_group) {
	return make_uniq<SingleFileRowGroupWriter>(table, checkpoint_manager.partial_block_manager, *this,
	                                           table_data_writer);
}